

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::InterfaceMatchingCase::iterate(InterfaceMatchingCase *this)

{
  glProgramUniform4fFunc p_Var1;
  glUseProgramFunc p_Var2;
  glUniform4fFunc p_Var3;
  glGetUniformLocationFunc p_Var4;
  glGetAttribLocationFunc p_Var5;
  GLuint GVar6;
  bool bVar7;
  int iVar8;
  int y;
  GLenum GVar9;
  GLint GVar10;
  deUint32 dVar11;
  RGBA expectedColor;
  TestLog *this_00;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar13;
  MessageBuilder *pMVar14;
  TestError *pTVar15;
  ostream *poVar16;
  ProgramInfo *pPVar17;
  char *pcVar18;
  PrecisionTests *local_12c0;
  PrecisionTests *local_12a8;
  Surface local_ff0;
  PixelBufferAccess local_fd8;
  GLuint local_fac;
  undefined1 local_fa8 [4];
  int posLoc;
  allocator<char> local_e21;
  string local_e20;
  allocator<char> local_df9;
  string local_df8;
  ProgramSources local_dd8;
  undefined1 local_d08 [8];
  ShaderProgram progVF;
  Surface local_c30;
  PixelBufferAccess local_c18;
  GLuint local_bec;
  char *pcStack_be8;
  int posLoc_1;
  MessageBuilder local_be0;
  string local_a60 [32];
  stringstream local_a40 [8];
  stringstream str;
  ostream local_a30;
  MessageBuilder local_8b8;
  ApiType local_738;
  int local_734;
  undefined1 local_730 [4];
  int precisionCompareResult;
  MessageBuilder local_710;
  string local_590;
  MessageBuilder local_570;
  undefined4 local_3f0;
  TestType local_3ec;
  undefined1 local_3e8 [4];
  TestType fragmentTestType;
  string fragmentPrecision;
  int fragmentTestIteration;
  TestType vertexTestType;
  string vertexPrecision;
  int vertexTestIteration;
  int maxTests;
  undefined1 *local_390;
  undefined1 local_388 [8];
  PrecisionTests fragmentPrecisionTests [7];
  allocator<char> local_267;
  allocator<char> local_266;
  allocator<char> local_265;
  allocator<char> local_264;
  allocator<char> local_263;
  allocator<char> local_262;
  allocator<char> local_261;
  undefined1 *local_260;
  undefined1 local_258 [8];
  PrecisionTests vertexPrecisionTests [7];
  undefined8 uStack_138;
  float position [16];
  int local_dc;
  GLchar *pGStack_d8;
  GLuint value;
  char *srcStrings [1];
  string local_c8 [4];
  GLuint pipeline;
  string frag2;
  string frag;
  string vtx;
  GLuint local_60;
  GLuint indexBuf;
  GLuint vertexBuf;
  GLuint vao;
  GLuint programB;
  GLuint programA;
  Surface renderedFrame;
  int viewportH;
  int viewportW;
  RenderTarget *renderTarget;
  Functions *gl;
  TestLog *log;
  InterfaceMatchingCase *this_local;
  Functions *gl_00;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar8 = (*pRVar12->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar8);
  pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar8 = (*pRVar12->_vptr_RenderContext[4])();
  y = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_00,iVar8));
  renderedFrame.m_pixels.m_cap._4_4_ = de::min<int>(0x10,y);
  iVar8 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar8));
  renderedFrame.m_pixels.m_cap._0_4_ = de::min<int>(0x10,iVar8);
  tcu::Surface::Surface
            ((Surface *)&programB,renderedFrame.m_pixels.m_cap._4_4_,
             (int)renderedFrame.m_pixels.m_cap);
  std::__cxx11::string::string((string *)(frag.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(frag2.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_c8);
  (*gl_00->viewport)(0,0,renderedFrame.m_pixels.m_cap._4_4_,(int)renderedFrame.m_pixels.m_cap);
  (*gl_00->clearColor)(0.0,0.0,0.0,0.0);
  (*gl_00->clear)(0x4000);
  position[10] = 1.0;
  position[0xb] = 1.0;
  position[0xc] = -1.0;
  position[0xd] = 1.0;
  position[6] = 1.0;
  position[7] = -1.0;
  position[8] = 0.0;
  position[9] = 1.0;
  position[2] = -1.0;
  position[3] = 1.0;
  position[4] = 0.0;
  position[5] = 1.0;
  uStack_138 = 0xbf800000bf800000;
  position[0] = 1.0;
  position[1] = 1.0;
  (*gl_00->genVertexArrays)(1,&indexBuf);
  (*gl_00->bindVertexArray)(indexBuf);
  (*gl_00->genBuffers)(1,(GLuint *)(vtx.field_2._M_local_buf + 0xc));
  (*gl_00->bindBuffer)(0x8893,vtx.field_2._12_4_);
  (*gl_00->bufferData)(0x8893,0xc,iterate::quadIndices,0x88e4);
  (*gl_00->genBuffers)(1,&local_60);
  (*gl_00->bindBuffer)(0x8892,local_60);
  (*gl_00->bufferData)(0x8892,0x40,&uStack_138,0x88e4);
  (*gl_00->genProgramPipelines)(1,(GLuint *)((long)srcStrings + 4));
  (*gl_00->bindProgramPipeline)(srcStrings[0]._4_4_);
  local_260 = local_258;
  local_258._0_4_ = DEFAULT_PRECISION;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)vertexPrecisionTests,"highp",&local_261);
  local_260 = (undefined1 *)((long)&vertexPrecisionTests[0].precision.field_2 + 8);
  vertexPrecisionTests[0].precision.field_2._8_4_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(vertexPrecisionTests + 1),"highp",&local_262);
  local_260 = (undefined1 *)((long)&vertexPrecisionTests[1].precision.field_2 + 8);
  vertexPrecisionTests[1].precision.field_2._8_4_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(vertexPrecisionTests + 2),"mediump",&local_263);
  local_260 = (undefined1 *)((long)&vertexPrecisionTests[2].precision.field_2 + 8);
  vertexPrecisionTests[2].precision.field_2._8_4_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(vertexPrecisionTests + 3),"lowp",&local_264);
  local_260 = (undefined1 *)((long)&vertexPrecisionTests[3].precision.field_2 + 8);
  vertexPrecisionTests[3].precision.field_2._8_4_ = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(vertexPrecisionTests + 4),"highp",&local_265);
  local_260 = (undefined1 *)((long)&vertexPrecisionTests[4].precision.field_2 + 8);
  vertexPrecisionTests[4].precision.field_2._8_4_ = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(vertexPrecisionTests + 5),"mediump",&local_266);
  local_260 = (undefined1 *)((long)&vertexPrecisionTests[5].precision.field_2 + 8);
  vertexPrecisionTests[5].precision.field_2._8_4_ = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(vertexPrecisionTests + 6),"lowp",&local_267);
  std::allocator<char>::~allocator(&local_267);
  std::allocator<char>::~allocator(&local_266);
  std::allocator<char>::~allocator(&local_265);
  std::allocator<char>::~allocator(&local_264);
  std::allocator<char>::~allocator(&local_263);
  std::allocator<char>::~allocator(&local_262);
  std::allocator<char>::~allocator(&local_261);
  vertexTestIteration._1_1_ = 1;
  local_390 = local_388;
  local_388._0_4_ = DEFAULT_PRECISION;
  getDefaultFragmentPrecision_abi_cxx11_((string *)fragmentPrecisionTests,this);
  local_390 = (undefined1 *)((long)&fragmentPrecisionTests[0].precision.field_2 + 8);
  fragmentPrecisionTests[0].precision.field_2._8_4_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(fragmentPrecisionTests + 1),"highp",(allocator<char> *)((long)&maxTests + 3)
            );
  local_390 = (undefined1 *)((long)&fragmentPrecisionTests[1].precision.field_2 + 8);
  fragmentPrecisionTests[1].precision.field_2._8_4_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(fragmentPrecisionTests + 2),"mediump",
             (allocator<char> *)((long)&maxTests + 2));
  local_390 = (undefined1 *)((long)&fragmentPrecisionTests[2].precision.field_2 + 8);
  fragmentPrecisionTests[2].precision.field_2._8_4_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(fragmentPrecisionTests + 3),"lowp",(allocator<char> *)((long)&maxTests + 1))
  ;
  local_390 = (undefined1 *)((long)&fragmentPrecisionTests[3].precision.field_2 + 8);
  fragmentPrecisionTests[3].precision.field_2._8_4_ = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(fragmentPrecisionTests + 4),"highp",(allocator<char> *)&maxTests);
  local_390 = (undefined1 *)((long)&fragmentPrecisionTests[4].precision.field_2 + 8);
  fragmentPrecisionTests[4].precision.field_2._8_4_ = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(fragmentPrecisionTests + 5),"mediump",
             (allocator<char> *)((long)&vertexTestIteration + 3));
  local_390 = (undefined1 *)((long)&fragmentPrecisionTests[5].precision.field_2 + 8);
  fragmentPrecisionTests[5].precision.field_2._8_4_ = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(fragmentPrecisionTests + 6),"lowp",
             (allocator<char> *)((long)&vertexTestIteration + 2));
  vertexTestIteration._1_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&vertexTestIteration + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&vertexTestIteration + 3));
  std::allocator<char>::~allocator((allocator<char> *)&maxTests);
  std::allocator<char>::~allocator((allocator<char> *)((long)&maxTests + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&maxTests + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&maxTests + 3));
  vertexPrecision.field_2._12_4_ = 7;
  vertexPrecision.field_2._8_4_ = 0;
  do {
    if ((int)vertexPrecision.field_2._12_4_ <= (int)vertexPrecision.field_2._8_4_) {
      (*gl_00->bindVertexArray)(0);
      (*gl_00->deleteVertexArrays)(1,&indexBuf);
      (*gl_00->deleteBuffers)(1,(GLuint *)(vtx.field_2._M_local_buf + 0xc));
      (*gl_00->deleteBuffers)(1,&local_60);
      (*gl_00->bindProgramPipeline)(0);
      (*gl_00->deleteProgramPipelines)(1,(GLuint *)((long)srcStrings + 4));
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      local_3f0 = 1;
      local_12a8 = (PrecisionTests *)((long)&fragmentPrecisionTests[6].precision.field_2 + 8);
      do {
        local_12a8 = local_12a8 + -1;
        iterate::PrecisionTests::~PrecisionTests(local_12a8);
      } while (local_12a8 != (PrecisionTests *)local_388);
      local_12c0 = (PrecisionTests *)((long)&vertexPrecisionTests[6].precision.field_2 + 8);
      do {
        local_12c0 = local_12c0 + -1;
        iterate::PrecisionTests::~PrecisionTests(local_12c0);
      } while (local_12c0 != (PrecisionTests *)local_258);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string((string *)(frag2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(frag.field_2._M_local_buf + 8));
      tcu::Surface::~Surface((Surface *)&programB);
      return STOP;
    }
    std::__cxx11::string::string
              ((string *)&fragmentTestIteration,
               (string *)(vertexPrecisionTests + (int)vertexPrecision.field_2._8_4_));
    fragmentPrecision.field_2._12_4_ =
         *(undefined4 *)
          ((long)&vertexPrecisionTests[(long)(int)vertexPrecision.field_2._8_4_ + -1].precision.
                  field_2 + 8);
    for (fragmentPrecision.field_2._8_4_ = 0;
        (int)fragmentPrecision.field_2._8_4_ < (int)vertexPrecision.field_2._12_4_;
        fragmentPrecision.field_2._8_4_ = fragmentPrecision.field_2._8_4_ + 1) {
      std::__cxx11::string::string
                ((string *)local_3e8,
                 (string *)(fragmentPrecisionTests + (int)fragmentPrecision.field_2._8_4_));
      local_3ec = *(TestType *)
                   ((long)&fragmentPrecisionTests[(long)(int)fragmentPrecision.field_2._8_4_ + -1].
                           precision.field_2 + 8);
      uVar13 = std::__cxx11::string::empty();
      if ((uVar13 & 1) == 0) {
        tcu::TestLog::operator<<(&local_570,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar14 = tcu::MessageBuilder::operator<<
                            (&local_570,(char (*) [26])"vertex shader precision: ");
        pMVar14 = tcu::MessageBuilder::operator<<
                            (pMVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&fragmentTestIteration);
        pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [21])", shader test mode: ");
        getTestTypeName_abi_cxx11_(&local_590,this,fragmentPrecision.field_2._12_4_);
        pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_590);
        tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_590);
        tcu::MessageBuilder::~MessageBuilder(&local_570);
        tcu::TestLog::operator<<(&local_710,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar14 = tcu::MessageBuilder::operator<<
                            (&local_710,(char (*) [28])"fragment shader precision: ");
        pMVar14 = tcu::MessageBuilder::operator<<
                            (pMVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_3e8);
        pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [21])", shader test mode: ");
        getTestTypeName_abi_cxx11_((string *)local_730,this,local_3ec);
        pMVar14 = tcu::MessageBuilder::operator<<
                            (pMVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_730);
        tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)local_730);
        tcu::MessageBuilder::~MessageBuilder(&local_710);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                  (this,(undefined1 *)((long)&frag.field_2 + 8),(ulong)this->m_glslVersion,
                   &fragmentTestIteration,(ulong)(uint)fragmentPrecision.field_2._12_4_);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                  (this,(undefined1 *)((long)&frag2.field_2 + 8),(ulong)this->m_glslVersion,
                   local_3e8);
        pGStack_d8 = (GLchar *)std::__cxx11::string::c_str();
        vao = (*gl_00->createShaderProgramv)(0x8b31,1,&stack0xffffffffffffff28);
        bVar7 = checkCSProg(this,gl_00,vao,1);
        if (!bVar7) {
          pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar15,"CreateShaderProgramv failed for vertex shader",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0xaac);
          __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        pGStack_d8 = (GLchar *)std::__cxx11::string::c_str();
        vertexBuf = (*gl_00->createShaderProgramv)(0x8b30,1,&stack0xffffffffffffff28);
        bVar7 = checkCSProg(this,gl_00,vertexBuf,1);
        if (!bVar7) {
          pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar15,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0xab2);
          __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        (*gl_00->useProgramStages)(srcStrings[0]._4_4_,1,vao);
        (*gl_00->useProgramStages)(srcStrings[0]._4_4_,2,vertexBuf);
        GVar9 = (*gl_00->getError)();
        glu::checkError(GVar9,"InterfaceMatching failure",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0xab7);
        (*gl_00->validateProgramPipeline)(srcStrings[0]._4_4_);
        (*gl_00->getProgramPipelineiv)(srcStrings[0]._4_4_,0x8b83,&local_dc);
        local_734 = std::__cxx11::string::compare((string *)local_3e8);
        pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
        local_738.m_bits = (*pRVar12->_vptr_RenderContext[2])();
        bVar7 = glu::isContextTypeES((ContextType)local_738.m_bits);
        if ((bVar7) && (local_734 != 0)) {
          if (local_dc != 0) {
            tcu::TestLog::startShaderProgram
                      (this_00,false,
                       "Precision mismatch, pipeline validation status GL_TRUE expected GL_FALSE");
            pcVar18 = (char *)std::__cxx11::string::c_str();
            tcu::TestLog::writeShader(this_00,QP_SHADER_TYPE_VERTEX,pcVar18,true,"");
            pcVar18 = (char *)std::__cxx11::string::c_str();
            tcu::TestLog::writeShader(this_00,QP_SHADER_TYPE_FRAGMENT,pcVar18,true,"");
            tcu::TestLog::endShaderProgram(this_00);
            pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar15,"InterfaceMatchingCase failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0xac9);
            __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          tcu::TestLog::operator<<(&local_8b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar14 = tcu::MessageBuilder::operator<<
                              (&local_8b8,
                               (char (*) [62])
                               "Precision mismatch, Pipeline validation status GL_FALSE -> OK");
          tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_8b8);
        }
        else {
          if (local_dc != 1) {
            std::__cxx11::stringstream::stringstream(local_a40);
            poVar16 = std::operator<<(&local_a30,"Precision ");
            pcVar18 = "matches";
            if (local_734 != 0) {
              pcVar18 = "mismatch";
            }
            poVar16 = std::operator<<(poVar16,pcVar18);
            std::operator<<(poVar16,", pipeline validation status GL_FALSE expected GL_TRUE");
            std::__cxx11::stringstream::str();
            pcVar18 = (char *)std::__cxx11::string::c_str();
            tcu::TestLog::startShaderProgram(this_00,false,pcVar18);
            std::__cxx11::string::~string(local_a60);
            pcVar18 = (char *)std::__cxx11::string::c_str();
            tcu::TestLog::writeShader(this_00,QP_SHADER_TYPE_VERTEX,pcVar18,true,"");
            pcVar18 = (char *)std::__cxx11::string::c_str();
            tcu::TestLog::writeShader(this_00,QP_SHADER_TYPE_FRAGMENT,pcVar18,true,"");
            tcu::TestLog::endShaderProgram(this_00);
            pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar15,"InterfaceMatchingCase failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0xadd);
            __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          tcu::TestLog::operator<<(&local_be0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar14 = tcu::MessageBuilder::operator<<(&local_be0,(char (*) [11])"Precision ");
          pcStack_be8 = "matches";
          if (local_734 != 0) {
            pcStack_be8 = "mismatch";
          }
          pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&stack0xfffffffffffff418);
          pMVar14 = tcu::MessageBuilder::operator<<
                              (pMVar14,(char (*) [43])", pipeline validation status GL_TRUE -> OK");
          tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_be0);
          (*gl_00->clear)(0x4000);
          local_bec = (*gl_00->getAttribLocation)(vao,"a_position");
          (*gl_00->vertexAttribPointer)(local_bec,4,0x1406,'\0',0,(void *)0x0);
          (*gl_00->enableVertexAttribArray)(local_bec);
          GVar6 = vao;
          p_Var1 = gl_00->programUniform4f;
          GVar10 = (*gl_00->getUniformLocation)(vao,"u_color");
          (*p_Var1)(GVar6,GVar10,1.0,1.0,1.0,1.0);
          GVar9 = (*gl_00->getError)();
          glu::checkError(GVar9,"StateInteraction failure, set uniform value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                          ,0xaeb);
          (*gl_00->drawElements)(4,6,0x1403,(void *)0x0);
          GVar9 = (*gl_00->getError)();
          glu::checkError(GVar9,"DrawElements failure",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                          ,0xaed);
          (*gl_00->disableVertexAttribArray)(local_bec);
          pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
          tcu::Surface::getAccess(&local_c18,(Surface *)&programB);
          glu::readPixels(pRVar12,0,0,&local_c18);
          tcu::Surface::Surface(&local_c30,(Surface *)&programB);
          progVF.m_program.m_info.linkTimeUs._4_4_ = tcu::RGBA::white();
          bVar7 = checkSurface(this,&local_c30,progVF.m_program.m_info.linkTimeUs._4_4_);
          tcu::Surface::~Surface(&local_c30);
          if (((bVar7 ^ 0xffU) & 1) != 0) {
            pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar15,"InterfaceMatchingCase failed; surface should be white",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0xaf5);
            __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
        }
        pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
        pcVar18 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_df8,pcVar18,&local_df9);
        pcVar18 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e20,pcVar18,&local_e21);
        glu::makeVtxFragSources(&local_dd8,&local_df8,&local_e20);
        glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_d08,pRVar12,&local_dd8);
        glu::ProgramSources::~ProgramSources(&local_dd8);
        std::__cxx11::string::~string((string *)&local_e20);
        std::allocator<char>::~allocator(&local_e21);
        std::__cxx11::string::~string((string *)&local_df8);
        std::allocator<char>::~allocator(&local_df9);
        p_Var2 = gl_00->useProgram;
        dVar11 = glu::ShaderProgram::getProgram((ShaderProgram *)local_d08);
        (*p_Var2)(dVar11);
        p_Var3 = gl_00->uniform4f;
        p_Var4 = gl_00->getUniformLocation;
        dVar11 = glu::ShaderProgram::getProgram((ShaderProgram *)local_d08);
        GVar10 = (*p_Var4)(dVar11,"u_color");
        (*p_Var3)(GVar10,1.0,1.0,1.0,1.0);
        pPVar17 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_d08);
        if ((pPVar17->linkOk & 1U) == 0) {
          glu::operator<<(this_00,(ShaderProgram *)local_d08);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)local_fa8,this_00,(BeginMessageToken *)&tcu::TestLog::Message
                    );
          pMVar14 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_fa8,
                               (char (*) [60])
                               "Non separable program link status GL_FALSE expected GL_TRUE");
          tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_fa8);
          pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar15,"InterfaceMatchingCase failed, non separable program should link",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0xb06);
          __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        p_Var5 = gl_00->getAttribLocation;
        dVar11 = glu::ShaderProgram::getProgram((ShaderProgram *)local_d08);
        local_fac = (*p_Var5)(dVar11,"a_position");
        (*gl_00->vertexAttribPointer)(local_fac,4,0x1406,'\0',0,(void *)0x0);
        (*gl_00->enableVertexAttribArray)(local_fac);
        (*gl_00->drawElements)(4,6,0x1403,(void *)0x0);
        (*gl_00->disableVertexAttribArray)(local_fac);
        GVar9 = (*gl_00->getError)();
        glu::checkError(GVar9,"StateInteraction failure, non separable program draw call",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0xb0f);
        pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
        tcu::Surface::getAccess(&local_fd8,(Surface *)&programB);
        glu::readPixels(pRVar12,0,0,&local_fd8);
        tcu::Surface::Surface(&local_ff0,(Surface *)&programB);
        expectedColor = tcu::RGBA::white();
        bVar7 = checkSurface(this,&local_ff0,expectedColor);
        tcu::Surface::~Surface(&local_ff0);
        if (((bVar7 ^ 0xffU) & 1) != 0) {
          pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar15,
                     "InterfaceMatchingCase failed, non separable program, unexpected color found",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0xb14);
          __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        (*gl_00->deleteProgram)(vao);
        (*gl_00->deleteProgram)(vertexBuf);
        (*gl_00->useProgram)(0);
        glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_d08);
        local_3f0 = 0;
      }
      else {
        local_3f0 = 7;
      }
      std::__cxx11::string::~string((string *)local_3e8);
    }
    std::__cxx11::string::~string((string *)&fragmentTestIteration);
    vertexPrecision.field_2._8_4_ = vertexPrecision.field_2._8_4_ + 1;
  } while( true );
}

Assistant:

IterateResult iterate(void)
	{
		TestLog&				 log		  = m_testCtx.getLog();
		const glw::Functions&	gl			  = m_context.getRenderContext().getFunctions();
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		int						 viewportW	= de::min(16, renderTarget.getWidth());
		int						 viewportH	= de::min(16, renderTarget.getHeight());
		tcu::Surface			 renderedFrame(viewportW, viewportH);

		glw::GLuint programA, programB;
		glw::GLuint vao, vertexBuf, indexBuf;
		std::string vtx;
		std::string frag, frag2;
		glw::GLuint pipeline;
		const char* srcStrings[1];
		glw::GLuint value;

		gl.viewport(0, 0, viewportW, viewportH);
		gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);

		static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };
		const float			  position[]	= { -1.0f, -1.0f, +1.0f, 1.0f, -1.0f, +1.0f, 0.0f,  1.0f,
								   +1.0f, -1.0f, 0.0f,  1.0f, +1.0f, +1.0f, -1.0f, 1.0f };

		/* Set up a vertex array object */
		gl.genVertexArrays(1, &vao);
		gl.bindVertexArray(vao);

		gl.genBuffers(1, &indexBuf);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBuf);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(quadIndices), quadIndices, GL_STATIC_DRAW);

		gl.genBuffers(1, &vertexBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, vertexBuf);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(position), position, GL_STATIC_DRAW);

		/* Set up shader pipeline */
		gl.genProgramPipelines(1, &pipeline);
		gl.bindProgramPipeline(pipeline);

		struct PrecisionTests
		{
			TestType	testType;
			std::string precision;
		};

		PrecisionTests vertexPrecisionTests[] = {
			{ DEFAULT_PRECISION, "highp" },	{ SET_DEFAULT_PRECISION, "highp" }, { SET_DEFAULT_PRECISION, "mediump" },
			{ SET_DEFAULT_PRECISION, "lowp" }, { SET_PRECISION, "highp" },		   { SET_PRECISION, "mediump" },
			{ SET_PRECISION, "lowp" }
		};

		PrecisionTests fragmentPrecisionTests[] = { { DEFAULT_PRECISION, getDefaultFragmentPrecision() },
													{ SET_DEFAULT_PRECISION, "highp" },
													{ SET_DEFAULT_PRECISION, "mediump" },
													{ SET_DEFAULT_PRECISION, "lowp" },
													{ SET_PRECISION, "highp" },
													{ SET_PRECISION, "mediump" },
													{ SET_PRECISION, "lowp" } };

		// Shader interface matching inputs/outputs precision
		int maxTests = 7;
		for (int vertexTestIteration = 0; vertexTestIteration < maxTests; vertexTestIteration++)
		{
			std::string vertexPrecision = vertexPrecisionTests[vertexTestIteration].precision;
			TestType	vertexTestType  = vertexPrecisionTests[vertexTestIteration].testType;
			for (int fragmentTestIteration = 0; fragmentTestIteration < maxTests; fragmentTestIteration++)
			{
				std::string fragmentPrecision = fragmentPrecisionTests[fragmentTestIteration].precision;
				TestType	fragmentTestType  = fragmentPrecisionTests[fragmentTestIteration].testType;
				if (fragmentPrecision.empty())
					continue;

				log << TestLog::Message << "vertex shader precision: " << vertexPrecision
					<< ", shader test mode: " << getTestTypeName(vertexTestType) << TestLog::EndMessage;

				log << TestLog::Message << "fragment shader precision: " << fragmentPrecision
					<< ", shader test mode: " << getTestTypeName(fragmentTestType) << TestLog::EndMessage;

				generateVarLinkVertexShaderSrc(vtx, m_glslVersion, vertexPrecision, vertexTestType);
				generateVarLinkFragmentShaderSrc(frag, m_glslVersion, fragmentPrecision, fragmentTestType);

				srcStrings[0] = vtx.c_str();
				programA	  = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, srcStrings);
				if (!checkCSProg(gl, programA))
				{
					TCU_FAIL("CreateShaderProgramv failed for vertex shader");
				}
				srcStrings[0] = frag.c_str();
				programB	  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, srcStrings);
				if (!checkCSProg(gl, programB))
				{
					TCU_FAIL("CreateShaderProgramv failed for fragment shader");
				}

				gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
				gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);
				GLU_EXPECT_NO_ERROR(gl.getError(), "InterfaceMatching failure");

				// Mismatched input and output qualifiers
				// For OpenGL ES contexts, this should result in a validation failure.
				// For OpenGL contexts, validation should succeed.
				gl.validateProgramPipeline(pipeline);
				gl.getProgramPipelineiv(pipeline, GL_VALIDATE_STATUS, (glw::GLint*)&value);
				int precisionCompareResult = fragmentPrecision.compare(vertexPrecision);
				if (glu::isContextTypeES(m_context.getRenderContext().getType()) && (precisionCompareResult != 0))
				{
					// precision mismatch
					if (value != GL_FALSE)
					{
						log.startShaderProgram(
							false, "Precision mismatch, pipeline validation status GL_TRUE expected GL_FALSE");
						log.writeShader(QP_SHADER_TYPE_VERTEX, vtx.c_str(), true, "");
						log.writeShader(QP_SHADER_TYPE_FRAGMENT, frag.c_str(), true, "");
						log.endShaderProgram();
						TCU_FAIL("InterfaceMatchingCase failed");
					}
					else
					{
						log << TestLog::Message << "Precision mismatch, Pipeline validation status GL_FALSE -> OK"
							<< TestLog::EndMessage;
					}
				}
				else
				{
					if (value != GL_TRUE)
					{
						std::stringstream str;
						str << "Precision " << (precisionCompareResult ? "mismatch" : "matches")
							<< ", pipeline validation status GL_FALSE expected GL_TRUE";

						log.startShaderProgram(false, str.str().c_str());
						log.writeShader(QP_SHADER_TYPE_VERTEX, vtx.c_str(), true, "");
						log.writeShader(QP_SHADER_TYPE_FRAGMENT, frag.c_str(), true, "");
						log.endShaderProgram();
						TCU_FAIL("InterfaceMatchingCase failed");
					}
					else
					{
						log << TestLog::Message << "Precision " << (precisionCompareResult ? "mismatch" : "matches")
							<< ", pipeline validation status GL_TRUE -> OK" << TestLog::EndMessage;
						// precision matches
						gl.clear(GL_COLOR_BUFFER_BIT);
						// white
						int posLoc = gl.getAttribLocation(programA, "a_position");
						gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, 0);
						gl.enableVertexAttribArray(posLoc);
						gl.programUniform4f(programA, gl.getUniformLocation(programA, "u_color"), 1.0f, 1.0f, 1.0f,
											1.0f);
						GLU_EXPECT_NO_ERROR(gl.getError(), "StateInteraction failure, set uniform value");
						gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
						GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");
						gl.disableVertexAttribArray(posLoc);

						glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

						// expect white
						if (!checkSurface(renderedFrame, tcu::RGBA::white()))
						{
							TCU_FAIL("InterfaceMatchingCase failed; surface should be white");
						}
					}
				}

				// validate non separable program

				glu::ShaderProgram progVF(m_context.getRenderContext(),
										  glu::makeVtxFragSources(vtx.c_str(), frag.c_str()));

				gl.useProgram(progVF.getProgram());
				gl.uniform4f(gl.getUniformLocation(progVF.getProgram(), "u_color"), 1.0f, 1.0f, 1.0f, 1.0f);
				if (!progVF.getProgramInfo().linkOk)
				{
					log << progVF;
					log << TestLog::Message << "Non separable program link status GL_FALSE expected GL_TRUE"
						<< TestLog::EndMessage;
					TCU_FAIL("InterfaceMatchingCase failed, non separable program should link");
				}

				int posLoc = gl.getAttribLocation(progVF.getProgram(), "a_position");
				gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, 0);
				gl.enableVertexAttribArray(posLoc);
				gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
				gl.disableVertexAttribArray(posLoc);

				GLU_EXPECT_NO_ERROR(gl.getError(), "StateInteraction failure, non separable program draw call");
				glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());
				// expect white
				if (!checkSurface(renderedFrame, tcu::RGBA::white()))
				{
					TCU_FAIL("InterfaceMatchingCase failed, non separable program, unexpected color found");
				}

				gl.deleteProgram(programA);
				gl.deleteProgram(programB);
				gl.useProgram(0);
			}
		}
		gl.bindVertexArray(0);
		gl.deleteVertexArrays(1, &vao);
		gl.deleteBuffers(1, &indexBuf);
		gl.deleteBuffers(1, &vertexBuf);
		gl.bindProgramPipeline(0);
		gl.deleteProgramPipelines(1, &pipeline);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}